

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::TestCaseTracking::TrackerBase::TrackerHasName::operator()
          (TrackerHasName *this,Ptr<Catch::TestCaseTracking::ITracker> *tracker)

{
  __type _Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar3 = (*(tracker->m_p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
            _vptr_NonCopyable[4])();
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(extraout_var,iVar3),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this)
  ;
  if (_Var1) {
    iVar3 = (*(tracker->m_p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
              _vptr_NonCopyable[4])();
    bVar2 = SourceLineInfo::operator==
                      ((SourceLineInfo *)(CONCAT44(extraout_var_00,iVar3) + 0x20),
                       &(this->m_nameAndLocation).location);
    return bVar2;
  }
  return false;
}

Assistant:

bool operator ()( Ptr<ITracker> const& tracker ) {
                return
                    tracker->nameAndLocation().name == m_nameAndLocation.name &&
                    tracker->nameAndLocation().location == m_nameAndLocation.location;
            }